

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtuiohandler.cpp
# Opt level: O1

void __thiscall QTuioHandler::process2DObjSet(QTuioHandler *this,QOscMessage *message)

{
  int *piVar1;
  long lVar2;
  QTextStream *this_00;
  int iVar3;
  uint t;
  Stream *__old_val;
  iterator iVar4;
  QDebug *pQVar5;
  QTuioToken *this_01;
  long in_FS_OFFSET;
  float t_00;
  float t_01;
  float t_02;
  float t_03;
  float t_04;
  float t_05;
  float t_06;
  float t_07;
  QByteArrayView QVar6;
  int id;
  QDebug local_80;
  QDebug local_78;
  QtPrivate local_70 [8];
  undefined1 local_68 [16];
  ulong local_58;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._0_8_ = (message->m_arguments).d.d;
  local_68._8_8_ = (message->m_arguments).d.ptr;
  local_58 = (message->m_arguments).d.size;
  if ((Data *)local_68._0_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_68._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_68._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         1;
    UNLOCK();
  }
  if (local_58 < 7) {
    lcTuioSet();
    if (((byte)lcTuioSet::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      process2DObjSet((QTuioHandler *)&local_58);
    }
  }
  else {
    iVar3 = QVariant::typeId((QVariant *)(local_68._8_8_ + 0x20));
    if (iVar3 == 2) {
      iVar3 = QVariant::typeId((QVariant *)(local_68._8_8_ + 0x40));
      if (iVar3 == 2) {
        iVar3 = QVariant::typeId((QVariant *)(local_68._8_8_ + 0x60));
        if (iVar3 == 0x26) {
          iVar3 = QVariant::typeId((QVariant *)(local_68._8_8_ + 0x80));
          if (iVar3 == 0x26) {
            iVar3 = QVariant::typeId((QVariant *)(local_68._8_8_ + 0xa0));
            if (iVar3 == 0x26) {
              iVar3 = QVariant::typeId((QVariant *)(local_68._8_8_ + 0xc0));
              if (iVar3 == 0x26) {
                iVar3 = QVariant::typeId((QVariant *)(local_68._8_8_ + 0xe0));
                if (iVar3 == 0x26) {
                  iVar3 = QVariant::typeId((QVariant *)(local_68._8_8_ + 0x100));
                  if (iVar3 == 0x26) {
                    iVar3 = QVariant::typeId((QVariant *)(local_68._8_8_ + 0x120));
                    if (iVar3 == 0x26) {
                      iVar3 = QVariant::typeId((QVariant *)(local_68._8_8_ + 0x140));
                      if (iVar3 == 0x26) {
                        local_80.stream._0_4_ = QVariant::toInt((bool *)(local_68._8_8_ + 0x20));
                        t = QVariant::toInt((bool *)(local_68._8_8_ + 0x40));
                        t_00 = (float)QVariant::toFloat((bool *)(local_68._8_8_ + 0x60));
                        t_01 = (float)QVariant::toFloat((bool *)(local_68._8_8_ + 0x80));
                        t_02 = (float)QVariant::toFloat((bool *)(local_68._8_8_ + 0xa0));
                        t_03 = (float)QVariant::toFloat((bool *)(local_68._8_8_ + 0xc0));
                        t_04 = (float)QVariant::toFloat((bool *)(local_68._8_8_ + 0xe0));
                        t_05 = (float)QVariant::toFloat((bool *)(local_68._8_8_ + 0x100));
                        t_06 = (float)QVariant::toFloat((bool *)(local_68._8_8_ + 0x120));
                        t_07 = (float)QVariant::toFloat((bool *)(local_68._8_8_ + 0x140));
                        iVar4 = QMap<int,_QTuioToken>::find
                                          ((QMap<int,_QTuioToken> *)(this + 0x48),(int *)&local_80);
                        QMap<int,_QTuioToken>::detach((QMap<int,_QTuioToken> *)(this + 0x48));
                        lVar2 = *(long *)(this + 0x48);
                        lcTuioSet();
                        if (iVar4.i._M_node == (_Base_ptr)(lVar2 + 0x10)) {
                          if (((byte)lcTuioSet::category.field_2.bools.enabledWarning._q_value.
                                     _M_base._M_i & 1) != 0) {
                            process2DObjSet((QTuioHandler *)(ulong)t);
                          }
                        }
                        else {
                          if (((byte)lcTuioSet::category.field_2.bools.enabledDebug._q_value._M_base
                                     ._M_i & 1) != 0) {
                            QMessageLogger::debug();
                            pQVar5 = QDebug::operator<<((QDebug *)&local_48,
                                                        "Processing SET for token ");
                            pQVar5 = QDebug::operator<<(pQVar5,t);
                            pQVar5 = QDebug::operator<<(pQVar5,(int)local_80.stream);
                            pQVar5 = QDebug::operator<<(pQVar5," @ ");
                            pQVar5 = QDebug::operator<<(pQVar5,t_00);
                            pQVar5 = QDebug::operator<<(pQVar5,t_01);
                            pQVar5 = QDebug::operator<<(pQVar5," angle: ");
                            pQVar5 = QDebug::operator<<(pQVar5,t_02);
                            pQVar5 = QDebug::operator<<(pQVar5,"vel");
                            pQVar5 = QDebug::operator<<(pQVar5,t_03);
                            pQVar5 = QDebug::operator<<(pQVar5,t_04);
                            pQVar5 = QDebug::operator<<(pQVar5,t_05);
                            pQVar5 = QDebug::operator<<(pQVar5,"acc");
                            pQVar5 = QDebug::operator<<(pQVar5,t_06);
                            QDebug::operator<<(pQVar5,t_07);
                            QDebug::~QDebug((QDebug *)&local_48);
                          }
                          this_01 = (QTuioToken *)((long)iVar4.i._M_node + 0x24);
                          *(uint *)((long)iVar4.i._M_node + 0x28) = t;
                          QTuioToken::setX(this_01,t_00);
                          QTuioToken::setY(this_01,t_01);
                          *(float *)((long)iVar4.i._M_node + 0x34) = t_03;
                          *(float *)((long)iVar4.i._M_node + 0x38) = t_04;
                          *(float *)((long)iVar4.i._M_node + 0x3c) = t_06;
                          QTuioToken::setAngle(this_01,t_02);
                          *(float *)((long)iVar4.i._M_node + 0x44) = t_07;
                          *(float *)((long)iVar4.i._M_node + 0x48) = t_07;
                        }
                        goto LAB_0010b54e;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    lcTuioSet();
    if (((byte)lcTuioSet::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      QMessageLogger::warning();
      this_00 = (QTextStream *)CONCAT44(local_80.stream._4_4_,(int)local_80.stream);
      QVar6.m_data = (storage_type *)0x34;
      QVar6.m_size = (qsizetype)&local_48;
      QString::fromUtf8(QVar6);
      QTextStream::operator<<(this_00,&local_48);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (((QTextStream *)CONCAT44(local_80.stream._4_4_,(int)local_80.stream))[0x30] ==
          (QTextStream)0x1) {
        QTextStream::operator<<
                  ((QTextStream *)CONCAT44(local_80.stream._4_4_,(int)local_80.stream),' ');
      }
      piVar1 = (int *)(CONCAT44(local_80.stream._4_4_,(int)local_80.stream) + 0x28);
      *piVar1 = *piVar1 + 1;
      local_78.stream = (Stream *)0x0;
      QtPrivate::printSequentialContainer<QList<QVariant>>
                (local_70,(Stream *)&local_48,"QList",(QList<QVariant> *)local_68);
      QDebug::~QDebug((QDebug *)&local_48);
      QDebug::~QDebug((QDebug *)local_70);
      QDebug::~QDebug(&local_78);
      QDebug::~QDebug(&local_80);
    }
  }
LAB_0010b54e:
  QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTuioHandler::process2DObjSet(const QOscMessage &message)
{
    QList<QVariant> arguments = message.arguments();
    if (arguments.size() < 7) {
        qCWarning(lcTuioSet) << "Ignoring malformed TUIO set message with too few arguments: " << arguments.size();
        return;
    }

    if (QMetaType::Type(arguments.at(1).userType()) != QMetaType::Int ||
            QMetaType::Type(arguments.at(2).userType()) != QMetaType::Int ||
            QMetaType::Type(arguments.at(3).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(4).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(5).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(6).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(7).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(8).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(9).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(10).userType()) != QMetaType::Float) {
        qCWarning(lcTuioSet) << "Ignoring malformed TUIO set message with bad types: " << arguments;
        return;
    }

    int id = arguments.at(1).toInt();
    int classId = arguments.at(2).toInt();
    float x = arguments.at(3).toFloat();
    float y = arguments.at(4).toFloat();
    float angle = arguments.at(5).toFloat();
    float vx = arguments.at(6).toFloat();
    float vy = arguments.at(7).toFloat();
    float angularVelocity = arguments.at(8).toFloat();
    float acceleration = arguments.at(9).toFloat();
    float angularAcceleration = arguments.at(10).toFloat();

    QMap<int, QTuioToken>::Iterator it = m_activeTokens.find(id);
    if (it == m_activeTokens.end()) {
        qCWarning(lcTuioSet) << "Ignoring malformed TUIO set for nonexistent token " << classId;
        return;
    }

    qCDebug(lcTuioSet) << "Processing SET for token " << classId << id << " @ " << x << y << " angle: " << angle <<
                          "vel" << vx << vy << angularVelocity << "acc" << acceleration << angularAcceleration;
    QTuioToken &tok = *it;
    tok.setClassId(classId);
    tok.setX(x);
    tok.setY(y);
    tok.setVX(vx);
    tok.setVY(vy);
    tok.setAcceleration(acceleration);
    tok.setAngle(angle);
    tok.setAngularVelocity(angularAcceleration);
    tok.setAngularAcceleration(angularAcceleration);
}